

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O3

void __thiscall
QtPromisePrivate::
PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::addHandler
          (PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
           *this,function<void_(const_(anonymous_namespace)::Foo_&)> *handler)

{
  pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> **pppVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *ppVar5;
  long lVar6;
  _Manager_type p_Var7;
  undefined8 uVar8;
  bool bVar9;
  QObject *pQVar10;
  Data *pDVar11;
  QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
  *old;
  long lVar12;
  _Invoker_type n;
  _Invoker_type extraout_RDX;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_> *this_00;
  pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *ppVar13;
  void *local_88;
  undefined8 uStack_80;
  QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
  *local_78;
  _Invoker_type p_Stack_70;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_> local_68;
  
  QReadWriteLock::lockForWrite();
  pQVar10 = (QObject *)QThread::currentThread();
  if (pQVar10 == (QObject *)0x0) {
    pDVar11 = (Data *)0x0;
  }
  else {
    pDVar11 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar10);
  }
  local_88 = (void *)0x0;
  uStack_80 = 0;
  local_78 = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
              *)0x0;
  n = handler->_M_invoker;
  old = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
         *)(handler->super__Function_base)._M_manager;
  if (old != (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
              *)0x0) {
    local_88 = *(void **)&(handler->super__Function_base)._M_functor;
    uStack_80 = *(undefined8 *)((long)&(handler->super__Function_base)._M_functor + 8);
    (handler->super__Function_base)._M_manager = (_Manager_type)0x0;
    handler->_M_invoker = (_Invoker_type)0x0;
    local_78 = old;
  }
  pDVar3 = (this->m_handlers).d.d;
  lVar4 = (this->m_handlers).d.size;
  p_Stack_70 = n;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    ppVar5 = (this->m_handlers).d.ptr;
    ppVar13 = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)
              ((ulong)((long)&pDVar3[1].super_QArrayData.flags.i + 3U) & 0xfffffffffffffff8);
    if ((pDVar3->super_QArrayData).alloc - lVar4 ==
        ((long)ppVar5 - (long)ppVar13 >> 4) * -0x5555555555555555) {
      if ((lVar4 != 0) || (ppVar13 == ppVar5)) goto LAB_00119a27;
      ppVar5[-1].first.wp.d = pDVar11;
      ppVar5[-1].first.wp.value = pQVar10;
      *(undefined8 *)&ppVar5[-1].second.super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&ppVar5[-1].second.super__Function_base._M_functor + 8) = 0;
      ppVar5[-1].second.super__Function_base._M_manager = (_Manager_type)0x0;
      ppVar5[-1].second._M_invoker = (_Invoker_type)n;
      if (old != (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
                  *)0x0) {
        *(void **)&ppVar5[-1].second.super__Function_base._M_functor = local_88;
        *(undefined8 *)((long)&ppVar5[-1].second.super__Function_base._M_functor + 8) = uStack_80;
        ppVar5[-1].second.super__Function_base._M_manager = (_Manager_type)local_78;
        local_78 = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
                    *)0x0;
        p_Stack_70 = (_Invoker_type)0x0;
      }
      pppVar1 = &(this->m_handlers).d.ptr;
      *pppVar1 = *pppVar1 + -1;
    }
    else {
      ppVar5[lVar4].first.wp.d = pDVar11;
      ppVar5[lVar4].first.wp.value = pQVar10;
      *(undefined8 *)&ppVar5[lVar4].second.super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&ppVar5[lVar4].second.super__Function_base._M_functor + 8) = 0;
      ppVar5[lVar4].second.super__Function_base._M_manager = (_Manager_type)0x0;
      ppVar5[lVar4].second._M_invoker = (_Invoker_type)n;
      if (old != (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
                  *)0x0) {
        *(void **)&ppVar5[lVar4].second.super__Function_base._M_functor = local_88;
        *(undefined8 *)((long)&ppVar5[lVar4].second.super__Function_base._M_functor + 8) = uStack_80
        ;
        ppVar5[lVar4].second.super__Function_base._M_manager = (_Manager_type)local_78;
        local_78 = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
                    *)0x0;
        p_Stack_70 = (_Invoker_type)0x0;
      }
    }
    pqVar2 = &(this->m_handlers).d.size;
    *pqVar2 = *pqVar2 + 1;
    goto LAB_00119d1a;
  }
LAB_00119a27:
  local_68.second.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_68.second.super__Function_base._M_functor._8_8_ = 0;
  local_68.second.super__Function_base._M_manager = (_Manager_type)0x0;
  if (old != (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
              *)0x0) {
    local_68.second.super__Function_base._M_functor._M_unused._M_object = local_88;
    local_68.second.super__Function_base._M_functor._8_8_ = uStack_80;
    local_78 = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
                *)0x0;
    p_Stack_70 = (_Invoker_type)0x0;
    local_68.second.super__Function_base._M_manager = (_Manager_type)old;
  }
  local_68.first.wp.d = pDVar11;
  local_68.first.wp.value = pQVar10;
  local_68.second._M_invoker = n;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_00119a77:
    QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
    ::reallocateAndGrow((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
                         *)&this->m_handlers,GrowsAtEnd,(qsizetype)n,old);
  }
  else {
    old = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
           *)((long)((long)(this->m_handlers).d.ptr -
                    ((ulong)((long)&pDVar3[1].super_QArrayData.flags.i + 3U) & 0xfffffffffffffff8))
             >> 4);
    if ((((pDVar3->super_QArrayData).alloc - lVar4) + (long)old * 0x5555555555555555 < 1) &&
       (bVar9 = QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
                ::tryReadjustFreeSpace
                          ((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
                            *)&this->m_handlers,GrowsAtEnd,(long)old * 0x5555555555555555,
                           (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>
                            **)old), n = extraout_RDX, !bVar9)) goto LAB_00119a77;
  }
  ppVar13 = (this->m_handlers).d.ptr;
  lVar6 = (this->m_handlers).d.size;
  ppVar5 = ppVar13 + lVar6;
  lVar12 = lVar6 - lVar4;
  if (lVar12 < 1) {
    (ppVar5->first).wp.d = local_68.first.wp.d;
    (ppVar5->first).wp.value = local_68.first.wp.value;
    local_68.first.wp.d = (Data *)0x0;
    local_68.first.wp.value = (QObject *)0x0;
    *(undefined8 *)&(ppVar5->second).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(ppVar5->second).super__Function_base._M_functor + 8) = 0;
    (ppVar5->second).super__Function_base._M_manager = (_Manager_type)0x0;
    (ppVar5->second)._M_invoker = (_Invoker_type)local_68.second._M_invoker;
    if ((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
         *)local_68.second.super__Function_base._M_manager !=
        (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
         *)0x0) {
      *(void **)&(ppVar5->second).super__Function_base._M_functor =
           local_68.second.super__Function_base._M_functor._M_unused._M_object;
      *(undefined8 *)((long)&(ppVar5->second).super__Function_base._M_functor + 8) =
           local_68.second.super__Function_base._M_functor._8_8_;
      (ppVar5->second).super__Function_base._M_manager =
           local_68.second.super__Function_base._M_manager;
      local_68.second.super__Function_base._M_manager = (_Manager_type)0x0;
      local_68.second._M_invoker = (_Invoker_type)0x0;
    }
    (this->m_handlers).d.ptr = ppVar13;
    (this->m_handlers).d.size = lVar6 + 1;
  }
  else {
    pQVar10 = ppVar5[-1].first.wp.value;
    (ppVar5->first).wp.d = ppVar5[-1].first.wp.d;
    (ppVar5->first).wp.value = pQVar10;
    (((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_> *)
     (ppVar13 + lVar6 + -1))->first).wp.d = (Data *)0x0;
    ppVar13[lVar6 + -1].first.wp.value = (QObject *)0x0;
    *(undefined8 *)&(ppVar5->second).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(ppVar5->second).super__Function_base._M_functor + 8) = 0;
    (ppVar5->second).super__Function_base._M_manager = (_Manager_type)0x0;
    p_Var7 = ppVar5[-1].second.super__Function_base._M_manager;
    (ppVar5->second)._M_invoker = ppVar5[-1].second._M_invoker;
    if (p_Var7 != (_Manager_type)0x0) {
      uVar8 = *(undefined8 *)((long)&ppVar5[-1].second.super__Function_base._M_functor + 8);
      *(undefined8 *)&(ppVar5->second).super__Function_base._M_functor =
           *(undefined8 *)&ppVar5[-1].second.super__Function_base._M_functor;
      *(undefined8 *)((long)&(ppVar5->second).super__Function_base._M_functor + 8) = uVar8;
      (ppVar5->second).super__Function_base._M_manager = p_Var7;
      ppVar5[-1].second.super__Function_base._M_manager = (_Manager_type)0x0;
      ppVar5[-1].second._M_invoker = (_Invoker_type)0x0;
    }
    if (lVar12 != 1) {
      lVar12 = 1 - lVar12;
      this_00 = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>
                 *)(ppVar13 + lVar6 + -1);
      do {
        std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>::
        operator=(this_00,this_00 + -1);
        lVar12 = lVar12 + 1;
        this_00 = this_00 + -1;
      } while (lVar12 != 0);
    }
    std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>::
    operator=((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_> *)
              (ppVar13 + lVar4),&local_68);
    (this->m_handlers).d.ptr = ppVar13;
    (this->m_handlers).d.size = lVar6 + 1;
    if ((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
         *)local_68.second.super__Function_base._M_manager !=
        (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
         *)0x0) {
      (*local_68.second.super__Function_base._M_manager)(&local_68.second,&local_68.second,3);
    }
  }
  if (local_68.first.wp.d != (Data *)0x0) {
    LOCK();
    *(int *)local_68.first.wp.d = *(int *)local_68.first.wp.d + -1;
    UNLOCK();
    if (*(int *)local_68.first.wp.d == 0) {
      pDVar11 = local_68.first.wp.d;
      if (local_68.first.wp.d == (Data *)0x0) {
        pDVar11 = (Data *)0x0;
      }
      operator_delete(pDVar11);
    }
  }
  if (local_78 !=
      (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
       *)0x0) {
    (*(code *)local_78)(&local_88,&local_88,3);
  }
LAB_00119d1a:
  if (((ulong)&this->field_0x11 & 1) != 0) {
    QReadWriteLock::unlock();
  }
  return;
}

Assistant:

void addHandler(std::function<F> handler)
    {
        QWriteLocker lock{&m_lock};
        m_handlers.append({QThread::currentThread(), std::move(handler)});
    }